

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::DoubleVector::SerializeWithCachedSizes
          (DoubleVector *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  uint value;
  double *a;
  
  if ((this->vector_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,10);
  }
  else {
    *output->buffer_ = '\n';
    output->buffer_ = output->buffer_ + 1;
    output->buffer_size_ = output->buffer_size_ + -1;
  }
  value = this->_vector_cached_byte_size_;
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    uVar6 = value;
    if (0x7f < value) {
      do {
        *pbVar5 = (byte)value | 0x80;
        uVar6 = value >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < value;
        value = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  pRVar2 = (this->vector_).rep_;
  a = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    a = (double *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteDoubleArray
            (a,(this->vector_).current_size_,output);
  return;
}

Assistant:

void DoubleVector::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.DoubleVector)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double vector = 1;
  if (this->vector_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_vector_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->vector().data(), this->vector_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.DoubleVector)
}